

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

String * __thiscall
cxxopts::Options::help_one_group(String *__return_storage_ptr__,Options *this,string *g)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  const_iterator cVar4;
  long *plVar5;
  _Base_ptr p_Var6;
  ulong *puVar7;
  size_type *psVar8;
  _Alloc_hider _Var9;
  _Alloc_hider _Var10;
  ulong uVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  _Alloc_hider _Var14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg;
  String s;
  String d;
  OptionHelp format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  String *local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  _Base_ptr local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined2 *local_f0;
  ulong local_e8;
  undefined2 local_e0;
  undefined1 local_de;
  undefined1 *local_d0;
  ulong local_c8;
  undefined1 local_c0 [16];
  pointer local_b0;
  _Base_ptr local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  ulong local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  _Base_ptr local_40;
  _Base_ptr local_38;
  
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>_>
          ::find(&(this->m_help)._M_t,g);
  if ((_Rb_tree_header *)cVar4._M_node == &(this->m_help)._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    local_58.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar1 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_168 = __return_storage_ptr__;
    if (g->_M_string_length != 0) {
      std::operator+(&local_110," ",g);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
      paVar2 = &local_188.field_2;
      puVar7 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar7) {
        local_188.field_2._M_allocated_capacity = *puVar7;
        local_188.field_2._8_8_ = plVar5[3];
        local_188._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_188.field_2._M_allocated_capacity = *puVar7;
        local_188._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_158.first._M_string_length = plVar5[1];
      *plVar5 = (long)puVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      paVar3 = &local_158.first.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p == paVar2) {
        local_158.first.field_2._8_8_ = local_188.field_2._8_8_;
        local_158.first._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_158.first._M_dataplus._M_p = local_188._M_dataplus._M_p;
      }
      local_158.first.field_2._M_allocated_capacity = local_188.field_2._M_allocated_capacity;
      local_188._M_string_length = 0;
      local_188.field_2._M_allocated_capacity =
           local_188.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_188._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_append((char *)local_168,(ulong)local_158.first._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158.first._M_dataplus._M_p != paVar3) {
        operator_delete(local_158.first._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != paVar2) {
        operator_delete(local_188._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
    }
    p_Var13 = *(_Base_ptr *)(cVar4._M_node + 4);
    local_118 = cVar4._M_node[4]._M_parent;
    local_160 = paVar1;
    local_a8 = cVar4._M_node;
    if (p_Var13 == local_118) {
      uVar11 = 0;
    }
    else {
      paVar1 = &local_158.first.field_2;
      paVar2 = &local_188.field_2;
      uVar11 = 0;
      do {
        local_f0 = &local_e0;
        local_e0 = 0x2020;
        local_e8 = 2;
        local_de = 0;
        if (p_Var13->_M_parent == (_Base_ptr)0x0) {
          std::__cxx11::string::append((char *)&local_f0);
        }
        else {
          std::operator+(&local_188,"-",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         p_Var13);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_188);
          puVar7 = (ulong *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar7) {
            local_158.first.field_2._M_allocated_capacity = *puVar7;
            local_158.first.field_2._8_8_ = plVar5[3];
            local_158.first._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_158.first.field_2._M_allocated_capacity = *puVar7;
            local_158.first._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_158.first._M_string_length = plVar5[1];
          *plVar5 = (long)puVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_158.first._M_dataplus._M_p)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158.first._M_dataplus._M_p != paVar1) {
            operator_delete(local_158.first._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar2) {
            operator_delete(local_188._M_dataplus._M_p);
          }
        }
        if (p_Var13[1]._M_parent != (_Base_ptr)0x0) {
          std::operator+(&local_158.first," --",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var13 + 1));
          std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_158.first._M_dataplus._M_p)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158.first._M_dataplus._M_p != paVar1) {
            operator_delete(local_158.first._M_dataplus._M_p);
          }
        }
        if ((char)p_Var13[3]._M_color == _S_black) {
          if (p_Var13[5]._M_right == (_Base_ptr)0x0) {
            local_158.first._M_string_length = 3;
            local_158.first.field_2._M_allocated_capacity._0_4_ = 0x677261;
            local_158.first._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_158.first._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_158,p_Var13[5]._M_left,
                       (long)&(p_Var13[5]._M_left)->_M_color +
                       (long)&(p_Var13[5]._M_right)->_M_color);
          }
          if (*(char *)&p_Var13[4]._M_parent == '\x01') {
            std::operator+(&local_78," [=",&local_158.first);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            psVar8 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar8) {
              local_a0.field_2._M_allocated_capacity = *psVar8;
              local_a0.field_2._8_8_ = plVar5[3];
            }
            else {
              local_a0.field_2._M_allocated_capacity = *psVar8;
              local_a0._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_a0._M_string_length = plVar5[1];
            *plVar5 = (long)psVar8;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_a0,(ulong)p_Var13[4]._M_left);
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            puVar7 = (ulong *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar7) {
              local_110.field_2._M_allocated_capacity = *puVar7;
              local_110.field_2._8_8_ = plVar5[3];
            }
            else {
              local_110.field_2._M_allocated_capacity = *puVar7;
              local_110._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_110._M_string_length = plVar5[1];
            *plVar5 = (long)puVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
            puVar7 = (ulong *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar7) {
              local_188.field_2._M_allocated_capacity = *puVar7;
              local_188.field_2._8_8_ = plVar5[3];
              local_188._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_188.field_2._M_allocated_capacity = *puVar7;
              local_188._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_188._M_string_length = plVar5[1];
            *plVar5 = (long)puVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_188._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != paVar2) {
              operator_delete(local_188._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p);
            }
            _Var9._M_p = local_78._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
LAB_00127983:
              operator_delete(_Var9._M_p);
            }
          }
          else {
            std::operator+(&local_188," ",&local_158.first);
            std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_188._M_dataplus._M_p);
            _Var9._M_p = local_188._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != paVar2) goto LAB_00127983;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158.first._M_dataplus._M_p != paVar1) {
            operator_delete(local_158.first._M_dataplus._M_p);
          }
        }
        if (uVar11 <= local_e8) {
          uVar11 = local_e8;
        }
        local_188._M_string_length = 0;
        local_188.field_2._M_allocated_capacity =
             local_188.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_188._M_dataplus._M_p = (pointer)paVar2;
        local_158.first._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,local_f0,local_e8 + (long)local_f0);
        local_158.second._M_dataplus._M_p = (pointer)&local_158.second.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p == paVar2) {
          local_158.second.field_2._8_8_ = local_188.field_2._8_8_;
        }
        else {
          local_158.second._M_dataplus._M_p = local_188._M_dataplus._M_p;
        }
        local_158.second.field_2._M_allocated_capacity = local_188.field_2._M_allocated_capacity;
        local_158.second._M_string_length = local_188._M_string_length;
        local_188._M_string_length = 0;
        local_188.field_2._M_allocated_capacity =
             local_188.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_188._M_dataplus._M_p = (pointer)paVar2;
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    *)&local_58,&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158.second._M_dataplus._M_p != &local_158.second.field_2) {
          operator_delete(local_158.second._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_158.first._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != paVar2) {
          operator_delete(local_188._M_dataplus._M_p);
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0);
        }
        p_Var13 = (_Base_ptr)&p_Var13[6]._M_left;
      } while (p_Var13 != local_118);
    }
    local_80 = 0x1e;
    if (uVar11 < 0x1e) {
      local_80 = uVar11;
    }
    p_Var13 = *(_Base_ptr *)(local_a8 + 4);
    local_40 = local_a8[4]._M_parent;
    __return_storage_ptr__ = local_168;
    if (p_Var13 != local_40) {
      p_Var12 = (_Base_ptr)(0x4a - local_80);
      local_b0 = local_58.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_118 = (_Base_ptr)(local_80 + 2);
      local_a8 = p_Var12;
      do {
        local_158.first._M_dataplus._M_p = (pointer)&local_158.first.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,*(long *)(p_Var13 + 2),
                   (long)&(p_Var13[2]._M_parent)->_M_color + *(long *)(p_Var13 + 2));
        if (*(byte *)((long)&p_Var13[3]._M_color + 1) == 1) {
          std::operator+(&local_a0," (default:",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &p_Var13[3]._M_parent);
          paVar1 = &local_110.field_2;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_a0);
          puVar7 = (ulong *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar7) {
            local_110.field_2._M_allocated_capacity = *puVar7;
            local_110.field_2._8_8_ = plVar5[3];
            local_110._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_110.field_2._M_allocated_capacity = *puVar7;
            local_110._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_188._M_string_length = plVar5[1];
          *plVar5 = (long)puVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p == paVar1) {
            local_188.field_2._8_8_ = local_110.field_2._8_8_;
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          }
          else {
            local_188._M_dataplus._M_p = local_110._M_dataplus._M_p;
          }
          local_188.field_2._M_allocated_capacity = local_110.field_2._M_allocated_capacity;
          local_110._M_string_length = 0;
          local_110.field_2._M_allocated_capacity =
               local_110.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_110._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_188._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != paVar1) {
            operator_delete(local_110._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
        }
        local_d0 = local_c0;
        local_c8 = 0;
        local_c0[0] = 0;
        _Var9._M_p = local_158.first._M_dataplus._M_p;
        local_38 = p_Var13;
        if (local_158.first._M_string_length != 0) {
          p_Var6 = (_Base_ptr)0x0;
          _Var10._M_p = local_158.first._M_dataplus._M_p;
          _Var14._M_p = local_158.first._M_dataplus._M_p;
          do {
            if (*_Var14._M_p == ' ') {
              _Var10._M_p = _Var14._M_p;
            }
            if (p_Var12 < p_Var6) {
              if (_Var10._M_p == _Var9._M_p) {
                std::__cxx11::string::replace
                          ((ulong)&local_d0,local_c8,(char *)0x0,(ulong)_Var9._M_p);
                paVar1 = &local_78.field_2;
                local_78.field_2._M_allocated_capacity._0_2_ = 10;
                local_78._M_string_length = 1;
                local_78._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_append((char *)&local_d0,(ulong)paVar1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p != paVar1) {
                  operator_delete(local_78._M_dataplus._M_p);
                }
                std::__cxx11::string::_M_replace_aux((ulong)&local_d0,local_c8,0,(char)local_118);
                _Var9._M_p = _Var14._M_p + 1;
                _Var10._M_p = _Var9._M_p;
              }
              else {
                std::__cxx11::string::replace
                          ((ulong)&local_d0,local_c8,(char *)0x0,(ulong)_Var9._M_p);
                local_e0 = 10;
                local_e8 = 1;
                local_f0 = &local_e0;
                std::__cxx11::string::_M_append((char *)&local_d0,(ulong)&local_e0);
                if (local_f0 != &local_e0) {
                  operator_delete(local_f0);
                }
                std::__cxx11::string::_M_replace_aux((ulong)&local_d0,local_c8,0,(char)local_118);
                _Var9._M_p = _Var10._M_p + 1;
                p_Var12 = local_a8;
              }
              p_Var6 = (_Base_ptr)0x0;
            }
            else {
              p_Var6 = (_Base_ptr)((long)&p_Var6->_M_color + 1);
            }
            _Var14._M_p = _Var14._M_p + 1;
          } while (_Var14._M_p !=
                   local_158.first._M_dataplus._M_p + local_158.first._M_string_length);
        }
        std::__cxx11::string::replace((ulong)&local_d0,local_c8,(char *)0x0,(ulong)_Var9._M_p);
        p_Var13 = local_38;
        __return_storage_ptr__ = local_168;
        paVar1 = &local_188.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158.first._M_dataplus._M_p != &local_158.first.field_2) {
          operator_delete(local_158.first._M_dataplus._M_p);
        }
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(local_b0->first)._M_dataplus._M_p);
        if (local_80 < (local_b0->first)._M_string_length) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          local_188._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct((ulong)&local_188,(char)local_118);
          local_158.first._M_dataplus._M_p = (pointer)&local_158.first.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p == paVar1) {
            local_158.first.field_2._8_8_ = local_188.field_2._8_8_;
          }
          else {
            local_158.first._M_dataplus._M_p = local_188._M_dataplus._M_p;
          }
          local_158.first.field_2._M_allocated_capacity = local_188.field_2._M_allocated_capacity;
          local_158.first._M_string_length = local_188._M_string_length;
          local_188._M_string_length = 0;
          local_188.field_2._M_allocated_capacity =
               local_188.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_188._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_158.first._M_dataplus._M_p);
        }
        else {
          local_188._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_188,(char)local_118 - (char)(local_b0->first)._M_string_length);
          local_158.first._M_dataplus._M_p = (pointer)&local_158.first.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p == paVar1) {
            local_158.first.field_2._8_8_ = local_188.field_2._8_8_;
          }
          else {
            local_158.first._M_dataplus._M_p = local_188._M_dataplus._M_p;
          }
          local_158.first.field_2._M_allocated_capacity = local_188.field_2._M_allocated_capacity;
          local_158.first._M_string_length = local_188._M_string_length;
          local_188._M_string_length = 0;
          local_188.field_2._M_allocated_capacity =
               local_188.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_188._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_158.first._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158.first._M_dataplus._M_p != &local_158.first.field_2) {
          operator_delete(local_158.first._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != paVar1) {
          operator_delete(local_188._M_dataplus._M_p);
        }
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_d0);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        if (local_d0 != local_c0) {
          operator_delete(local_d0);
        }
        local_b0 = local_b0 + 1;
        p_Var13 = (_Base_ptr)&p_Var13[6]._M_left;
      } while (p_Var13 != local_40);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

String
Options::help_one_group(const std::string& g) const
{
  typedef std::vector<std::pair<String, String>> OptionHelp;

  auto group = m_help.find(g);
  if (group == m_help.end())
  {
    return "";
  }

  OptionHelp format;

  size_t longest = 0;

  String result;

  if (!g.empty())
  {
    result += toLocalString(" " + g + " options:\n\n");
  }

  for (const auto& o : group->second.options)
  {
    auto s = format_option(o);
    longest = std::max(longest, stringLength(s));
    format.push_back(std::make_pair(s, String()));
  }

  longest = std::min(longest, static_cast<size_t>(OPTION_LONGEST));

  //widest allowed description
  auto allowed = size_t{76} - longest - OPTION_DESC_GAP;

  auto fiter = format.begin();
  for (const auto& o : group->second.options)
  {
    auto d = format_description(o, longest + OPTION_DESC_GAP, allowed);

    result += fiter->first;
    if (stringLength(fiter->first) > longest)
    {
      result += "\n";
      result += toLocalString(std::string(longest + OPTION_DESC_GAP, ' '));
    }
    else
    {
      result += toLocalString(std::string(longest + OPTION_DESC_GAP -
        stringLength(fiter->first),
        ' '));
    }
    result += d;
    result += "\n";

    ++fiter;
  }

  return result;
}